

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O3

Address * __thiscall Settings::getProxyAddr(Settings *this,String *destination_)

{
  usize *puVar1;
  usize uVar2;
  Item *pIVar3;
  Array<Address> *pAVar4;
  uint uVar5;
  Iterator IVar6;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  Array<Address> *pAVar12;
  char *pcVar13;
  Address *pAVar14;
  String destination;
  String local_80;
  String local_58;
  long lVar7;
  
  pAVar14 = (Address *)&this->_destinationHttpProxyAddrs;
  IVar6 = HashMap<String,_Array<Address>_>::find
                    ((HashMap<String,_Array<Address>_> *)pAVar14,destination_);
  if (IVar6.item != (this->_destinationHttpProxyAddrs)._end.item) {
    pAVar12 = &(IVar6.item)->value;
    pAVar14 = ((IVar6.item)->value)._begin.item;
    lVar7 = Math::random();
    uVar5 = (uint)lVar7;
    pAVar4 = &(IVar6.item)->value;
    goto LAB_00109d74;
  }
  uVar2 = destination_->data->len;
  if (0 < (long)uVar2) {
    pcVar11 = destination_->data->str;
    pcVar8 = pcVar11 + uVar2;
    pcVar13 = pcVar11;
    do {
      pcVar13 = pcVar13 + 1;
      if (*pcVar11 == '.') {
        pcVar11 = String::operator_cast_to_char_(destination_);
        String::substr(&local_80,destination_,(long)pcVar13 - (long)pcVar11,-1);
        goto LAB_00109c67;
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 < pcVar8);
  }
  goto LAB_00109d63;
LAB_00109c67:
  IVar6 = HashMap<String,_Array<Address>_>::find
                    ((HashMap<String,_Array<Address>_> *)pAVar14,&local_80);
  pIVar3 = (((DestinationHttpProxyAddrsMap *)pAVar14)->_end).item;
  if (IVar6.item == pIVar3) {
    if ((long)(local_80.data)->len < 1) goto LAB_00109d41;
    pcVar11 = (local_80.data)->str;
    pcVar8 = pcVar11 + (local_80.data)->len;
    pcVar13 = pcVar11;
    while (pcVar13 = pcVar13 + 1, *pcVar11 != '.') {
      pcVar11 = pcVar11 + 1;
      if (pcVar8 <= pcVar11) goto LAB_00109d41;
    }
    pcVar9 = String::operator_cast_to_char_(&local_80);
    pcVar8 = pcVar13 + -(long)pcVar9;
    pcVar11 = (char *)(local_80.data)->len;
    if ((long)(pcVar8 + -1) < -1) {
      pcVar8 = pcVar13 + ((long)pcVar11 - (long)pcVar9);
      if ((long)pcVar8 < 1) {
        pcVar8 = (char *)0x0;
      }
    }
    else if (pcVar11 < pcVar8) {
      pcVar8 = pcVar11;
    }
    String::String(&local_58,pcVar8 + (long)(local_80.data)->str,(long)pcVar11 - (long)pcVar8);
    String::operator=(&local_80,&local_58);
    if ((local_58.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
        operator_delete__(local_58.data);
      }
    }
    goto LAB_00109c67;
  }
  pAVar14 = ((IVar6.item)->value)._begin.item;
  uVar10 = Math::random();
  pAVar14 = pAVar14 + (uVar10 & 0xffffffff) %
                      (ulong)((long)((IVar6.item)->value)._end.item -
                              (long)((IVar6.item)->value)._begin.item >> 3);
LAB_00109d41:
  if ((local_80.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_80.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
      operator_delete__(local_80.data);
    }
  }
  if (IVar6.item != pIVar3) {
    return pAVar14;
  }
LAB_00109d63:
  pAVar12 = &this->_httpProxyAddrs;
  pAVar14 = (this->_httpProxyAddrs)._begin.item;
  lVar7 = Math::random();
  uVar5 = (uint)lVar7;
  pAVar4 = &this->_httpProxyAddrs;
LAB_00109d74:
  return pAVar14 + (ulong)uVar5 %
                   (ulong)((long)(pAVar4->_end).item - (long)(pAVar12->_begin).item >> 3);
}

Assistant:

const Address& Settings::getProxyAddr(const String& destination_)
{
    DestinationHttpProxyAddrsMap::Iterator it = _destinationHttpProxyAddrs.find(destination_);
    if (it != _destinationHttpProxyAddrs.end())
        return getRandomProxyAddr(*it);
    if (const char* x = destination_.find('.'))
    {
        String destination = destination_.substr(x - (const char*)destination_ + 1);
        for (;;)
        {
            it = _destinationHttpProxyAddrs.find(destination);
            if (it != _destinationHttpProxyAddrs.end())
                return getRandomProxyAddr(*it);
            const char* x = destination.find('.');
            if (!x)
                break;
            destination = destination.substr(x - (const char*)destination + 1);
        }
    }
    return getRandomProxyAddr(_httpProxyAddrs);
}